

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::tls12_add_verify_sigalgs(SSL_HANDSHAKE *hs,CBB *out)

{
  long lVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  unsigned_short *puVar5;
  
  sVar4 = (hs->config->verify_sigalgs).size_;
  if (sVar4 == 0) {
    puVar5 = &kVerifySignatureAlgorithms;
    sVar4 = 9;
  }
  else {
    puVar5 = (hs->config->verify_sigalgs).data_;
  }
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (sVar4 * 2 == lVar3) break;
    iVar2 = CBB_add_u16(out,*(uint16_t *)((long)puVar5 + lVar3));
    lVar1 = lVar3 + 2;
  } while (iVar2 != 0);
  return sVar4 * 2 == lVar3;
}

Assistant:

bool tls12_add_verify_sigalgs(const SSL_HANDSHAKE *hs, CBB *out) {
  for (uint16_t sigalg : tls12_get_verify_sigalgs(hs)) {
    if (!CBB_add_u16(out, sigalg)) {
      return false;
    }
  }
  return true;
}